

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::AsyncCase::verify
          (AsyncCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  int refCount_00;
  bool bVar1;
  TestLog *this_00;
  pointer id_00;
  pointer ppVar2;
  MessageBuilder *this_01;
  MessageBuilder local_238;
  undefined1 local_a8 [8];
  VerificationResult result;
  bool enabled;
  int resCount;
  int refCount;
  MessageID *id;
  _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>
  local_40;
  iterator local_38;
  _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>
  local_30;
  const_iterator itr;
  ScopedLock lock;
  TestLog *log;
  VerifyState retval;
  bool uselog_local;
  AsyncCase *this_local;
  
  log._0_4_ = 0;
  this_00 = tcu::TestContext::getLog
                      ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
  de::ScopedLock::ScopedLock((ScopedLock *)&itr,&this->m_mutex);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>_>
       ::begin(&this->m_counts);
  std::
  _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>
  ::_Rb_tree_const_iterator(&local_30,&local_38);
  while( true ) {
    id = (MessageID *)
         std::
         map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>_>
         ::end(&this->m_counts);
    std::
    _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>
    ::_Rb_tree_const_iterator(&local_40,(iterator *)&id);
    bVar1 = std::operator!=(&local_30,&local_40);
    if (!bVar1) break;
    id_00 = std::
            _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>
            ::operator->(&local_30);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>
             ::operator->(&local_30);
    refCount_00 = (ppVar2->second).expected;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>
             ::operator->(&local_30);
    result.logMessage.field_2._M_local_buf[0xf] = '\x01';
    BaseCase::verifyMessageCount
              ((VerificationResult *)local_a8,&this->super_BaseCase,&id_00->first,0x1100,refCount_00
               ,(ppVar2->second).received,true);
    if (((ulong)ctx & 1) != 0) {
      tcu::TestLog::operator<<(&local_238,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      this_01 = tcu::MessageBuilder::operator<<
                          (&local_238,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&result.resultMessage.field_2 + 8));
      tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_238);
    }
    if (local_a8._0_4_ == QP_TEST_RESULT_FAIL) {
      log._0_4_ = 2;
    }
    else if ((local_a8._0_4_ != QP_TEST_RESULT_PASS) && ((int)log == 0)) {
      log._0_4_ = 1;
    }
    BaseCase::VerificationResult::~VerificationResult((VerificationResult *)local_a8);
    std::
    _Rb_tree_const_iterator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>
    ::operator++(&local_30,0);
  }
  de::ScopedLock::~ScopedLock((ScopedLock *)&itr);
  return (int)log;
}

Assistant:

AsyncCase::VerifyState AsyncCase::verify (bool uselog)
{
	using std::map;

	VerifyState			retval		= VERIFY_PASS;
	TestLog&			log			= m_testCtx.getLog();

	const de::ScopedLock lock(m_mutex);

	for (map<MessageID, MessageCount>::const_iterator itr = m_counts.begin(); itr != m_counts.end(); itr++)
	{
		const MessageID&	id			= itr->first;

		const int			refCount	= itr->second.expected;
		const int			resCount	= itr->second.received;
		const bool			enabled		= true;

		VerificationResult	result		= verifyMessageCount(id, GL_DONT_CARE, refCount, resCount, enabled);

		if (uselog)
			log << TestLog::Message << result.logMessage << TestLog::EndMessage;

		if (result.result == QP_TEST_RESULT_FAIL)
			retval = VERIFY_FAIL;
		else if (result.result != QP_TEST_RESULT_PASS && retval == VERIFY_PASS)
			retval = VERIFY_MINIMUM;
	}

	return retval;
}